

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_flags nk_convert(nk_context *ctx,nk_buffer *cmds,nk_buffer *vertices,nk_buffer *elements,
                   nk_convert_config *config)

{
  nk_color col;
  nk_color top;
  nk_color col_00;
  int len;
  nk_color fg;
  nk_user_font *font;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  nk_vec2 p1;
  nk_vec2 nVar4;
  nk_vec2 nVar5;
  nk_vec2 nVar6;
  nk_rect nVar7;
  nk_command_custom *c_4;
  nk_command_image *i_3;
  nk_command_text *t_2;
  nk_vec2 pnt_2;
  nk_command_polyline *p_2;
  int i_2;
  nk_vec2 pnt_1;
  nk_command_polygon_filled *p_1;
  int i_1;
  nk_vec2 pnt;
  nk_command_polygon *p;
  int i;
  nk_command_triangle_filled *t_1;
  nk_command_triangle *t;
  nk_command_arc_filled *c_3;
  nk_command_arc *c_2;
  nk_command_circle_filled *c_1;
  nk_command_circle *c;
  nk_command_rect_multi_color *r_2;
  nk_command_rect_filled *r_1;
  nk_command_rect *r;
  nk_command_curve *q;
  nk_command_line *l;
  nk_command_scissor *s;
  nk_command *cmd;
  nk_flags res;
  nk_convert_config *config_local;
  nk_buffer *elements_local;
  nk_buffer *vertices_local;
  nk_buffer *cmds_local;
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2844,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (cmds == (nk_buffer *)0x0) {
    __assert_fail("cmds",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2845,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (vertices == (nk_buffer *)0x0) {
    __assert_fail("vertices",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2846,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (elements == (nk_buffer *)0x0) {
    __assert_fail("elements",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2847,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (config == (nk_convert_config *)0x0) {
    __assert_fail("config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2848,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (config->vertex_layout == (nk_draw_vertex_layout_element *)0x0) {
    __assert_fail("config->vertex_layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x2849,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if (config->vertex_size == 0) {
    __assert_fail("config->vertex_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x284a,
                  "nk_flags nk_convert(struct nk_context *, struct nk_buffer *, struct nk_buffer *, struct nk_buffer *, const struct nk_convert_config *)"
                 );
  }
  if ((((ctx == (nk_context *)0x0) || (cmds == (nk_buffer *)0x0)) || (vertices == (nk_buffer *)0x0))
     || (((elements == (nk_buffer *)0x0 || (config == (nk_convert_config *)0x0)) ||
         (config->vertex_layout == (nk_draw_vertex_layout_element *)0x0)))) {
    ctx_local._4_4_ = 1;
  }
  else {
    nk_draw_list_setup(&ctx->draw_list,config,cmds,vertices,elements,config->line_AA,
                       config->shape_AA);
    for (s = (nk_command_scissor *)nk__begin(ctx); s != (nk_command_scissor *)0x0;
        s = (nk_command_scissor *)nk__next(ctx,&s->header)) {
      switch((s->header).type) {
      case NK_COMMAND_NOP:
        break;
      case NK_COMMAND_SCISSOR:
        nVar7 = nk_rect((float)(int)s->x,(float)(int)s->y,(float)s->w,(float)s->h);
        nk_draw_list_add_clip(&ctx->draw_list,nVar7);
        break;
      case NK_COMMAND_LINE:
        nVar6 = nk_vec2((float)(int)s->y,(float)(int)(short)s->w);
        nVar4 = nk_vec2((float)(int)(short)s->h,(float)(int)(short)s[1].header.type);
        nk_draw_list_stroke_line
                  (&ctx->draw_list,nVar6,nVar4,*(nk_color *)((long)&s[1].header.type + 2),
                   (float)(ushort)s->x);
        break;
      case NK_COMMAND_CURVE:
        nVar6 = nk_vec2((float)(int)s->y,(float)(int)(short)s->w);
        nVar4 = nk_vec2((float)(int)(short)*(undefined2 *)((long)&s[1].header.type + 2),
                        (float)(int)*(short *)&s[1].header.field_0x4);
        nVar5 = nk_vec2((float)(int)*(short *)&s[1].header.field_0x6,
                        (float)(int)(short)s[1].header.next);
        p1 = nk_vec2((float)(int)(short)s->h,(float)(int)(short)s[1].header.type);
        nk_draw_list_stroke_curve
                  (&ctx->draw_list,nVar6,nVar4,nVar5,p1,*(nk_color *)((long)&s[1].header.next + 2),
                   config->curve_segment_count,(float)(ushort)s->x);
        break;
      case NK_COMMAND_RECT:
        nVar7 = nk_rect((float)(int)(short)s->w,(float)(int)(short)s->h,
                        (float)(ushort)(short)s[1].header.type,
                        (float)(ushort)*(undefined2 *)((long)&s[1].header.type + 2));
        col.r = s[1].header.field_0x4;
        col.g = s[1].header.field_0x5;
        col.b = s[1].header.field_0x6;
        col.a = s[1].header.field_0x7;
        nk_draw_list_stroke_rect(&ctx->draw_list,nVar7,col,(float)(ushort)s->x,(float)(ushort)s->y);
        break;
      case NK_COMMAND_RECT_FILLED:
        nVar7 = nk_rect((float)(int)s->y,(float)(int)(short)s->w,(float)s->h,
                        (float)(ushort)(short)s[1].header.type);
        nk_draw_list_fill_rect
                  (&ctx->draw_list,nVar7,*(nk_color *)((long)&s[1].header.type + 2),
                   (float)(ushort)s->x);
        break;
      case NK_COMMAND_RECT_MULTI_COLOR:
        nVar7 = nk_rect((float)(int)s->x,(float)(int)s->y,(float)s->w,(float)s->h);
        top.r = s[1].header.field_0x4;
        top.g = s[1].header.field_0x5;
        top.b = s[1].header.field_0x6;
        top.a = s[1].header.field_0x7;
        nk_draw_list_fill_rect_multi_color
                  (&ctx->draw_list,nVar7,(nk_color)s[1].header.type,top,
                   *(nk_color *)((long)&s[1].header.next + 4),*(nk_color *)&s[1].header.next);
        break;
      case NK_COMMAND_CIRCLE:
        nVar6 = nk_vec2((float)(int)s->x + (float)s->h * 0.5,
                        (float)(int)s->y + (float)(ushort)(short)s[1].header.type * 0.5);
        nk_draw_list_stroke_circle
                  (&ctx->draw_list,nVar6,(float)s->h * 0.5,
                   *(nk_color *)((long)&s[1].header.type + 2),config->circle_segment_count,
                   (float)s->w);
        break;
      case NK_COMMAND_CIRCLE_FILLED:
        nVar6 = nk_vec2((float)(int)s->x + (float)s->w * 0.5,(float)(int)s->y + (float)s->h * 0.5);
        nk_draw_list_fill_circle
                  (&ctx->draw_list,nVar6,(float)s->w * 0.5,(nk_color)s[1].header.type,
                   config->circle_segment_count);
        break;
      case NK_COMMAND_ARC:
        nVar6 = nk_vec2((float)(int)s->x,(float)(int)s->y);
        nk_draw_list_path_line_to(&ctx->draw_list,nVar6);
        nVar6 = nk_vec2((float)(int)s->x,(float)(int)s->y);
        nk_draw_list_path_arc_to
                  (&ctx->draw_list,nVar6,(float)s->w,(float)s[1].header.type,
                   *(float *)&s[1].header.field_0x4,config->arc_segment_count);
        nk_draw_list_path_stroke
                  (&ctx->draw_list,*(nk_color *)&s[1].header.next,NK_STROKE_CLOSED,(float)s->h);
        break;
      case NK_COMMAND_ARC_FILLED:
        nVar6 = nk_vec2((float)(int)s->x,(float)(int)s->y);
        nk_draw_list_path_line_to(&ctx->draw_list,nVar6);
        nVar6 = nk_vec2((float)(int)s->x,(float)(int)s->y);
        nk_draw_list_path_arc_to
                  (&ctx->draw_list,nVar6,(float)s->w,(float)s[1].header.type,
                   *(float *)&s[1].header.field_0x4,config->arc_segment_count);
        nk_draw_list_path_fill(&ctx->draw_list,*(nk_color *)&s[1].header.next);
        break;
      case NK_COMMAND_TRIANGLE:
        nVar6 = nk_vec2((float)(int)s->y,(float)(int)(short)s->w);
        nVar4 = nk_vec2((float)(int)(short)s->h,(float)(int)(short)s[1].header.type);
        nVar5 = nk_vec2((float)(int)(short)*(undefined2 *)((long)&s[1].header.type + 2),
                        (float)(int)*(short *)&s[1].header.field_0x4);
        nk_draw_list_stroke_triangle
                  (&ctx->draw_list,nVar6,nVar4,nVar5,*(nk_color *)&s[1].header.field_0x6,
                   (float)(ushort)s->x);
        break;
      case NK_COMMAND_TRIANGLE_FILLED:
        nVar6 = nk_vec2((float)(int)s->x,(float)(int)s->y);
        nVar4 = nk_vec2((float)(int)(short)s->w,(float)(int)(short)s->h);
        nVar5 = nk_vec2((float)(int)(short)s[1].header.type,
                        (float)(int)(short)*(undefined2 *)((long)&s[1].header.type + 2));
        col_00.r = s[1].header.field_0x4;
        col_00.g = s[1].header.field_0x5;
        col_00.b = s[1].header.field_0x6;
        col_00.a = s[1].header.field_0x7;
        nk_draw_list_fill_triangle(&ctx->draw_list,nVar6,nVar4,nVar5,col_00);
        break;
      case NK_COMMAND_POLYGON:
        for (p._4_4_ = 0; p._4_4_ < (int)(uint)s->h; p._4_4_ = p._4_4_ + 1) {
          nVar6 = nk_vec2((float)(int)(short)(&s[1].header.type)[p._4_4_],
                          (float)(int)*(short *)((long)&s[1].header.type + (long)p._4_4_ * 4 + 2));
          nk_draw_list_path_line_to(&ctx->draw_list,nVar6);
        }
        nk_draw_list_path_stroke(&ctx->draw_list,*(nk_color *)&s->x,NK_STROKE_CLOSED,(float)s->w);
        break;
      case NK_COMMAND_POLYGON_FILLED:
        for (p_1._4_4_ = 0; p_1._4_4_ < (int)(uint)s->w; p_1._4_4_ = p_1._4_4_ + 1) {
          nVar6 = nk_vec2((float)(int)(short)(&s->h)[(long)p_1._4_4_ * 2],
                          (float)(int)(short)(&s[1].header.type)[p_1._4_4_]);
          nk_draw_list_path_line_to(&ctx->draw_list,nVar6);
        }
        nk_draw_list_path_fill(&ctx->draw_list,*(nk_color *)&s->x);
        break;
      case NK_COMMAND_POLYLINE:
        for (p_2._4_4_ = 0; p_2._4_4_ < (int)(uint)s->h; p_2._4_4_ = p_2._4_4_ + 1) {
          nVar6 = nk_vec2((float)(int)(short)(&s[1].header.type)[p_2._4_4_],
                          (float)(int)*(short *)((long)&s[1].header.type + (long)p_2._4_4_ * 4 + 2))
          ;
          nk_draw_list_path_line_to(&ctx->draw_list,nVar6);
        }
        nk_draw_list_path_stroke(&ctx->draw_list,*(nk_color *)&s->x,NK_STROKE_OPEN,(float)s->w);
        break;
      case NK_COMMAND_TEXT:
        font = *(nk_user_font **)&s->x;
        nVar7 = nk_rect((float)(int)(short)s[1].header.next,
                        (float)(int)*(short *)((long)&s[1].header.next + 2),
                        (float)*(ushort *)((long)&s[1].header.next + 4),
                        (float)*(ushort *)((long)&s[1].header.next + 6));
        len._0_2_ = s[1].w;
        len._2_2_ = s[1].h;
        fg.r = s[1].header.field_0x4;
        fg.g = s[1].header.field_0x5;
        fg.b = s[1].header.field_0x6;
        fg.a = s[1].header.field_0x7;
        nk_draw_list_add_text(&ctx->draw_list,font,nVar7,(char *)(s + 2),len,*(float *)&s[1].x,fg);
        break;
      case NK_COMMAND_IMAGE:
        nVar7 = nk_rect((float)(int)s->x,(float)(int)s->y,(float)s->w,(float)s->h);
        nk_draw_list_add_image(&ctx->draw_list,(nk_image)s[1],nVar7,(nk_color)s[2].header.type);
        break;
      case NK_COMMAND_CUSTOM:
        (*(code *)s[1].header.next)
                  (&ctx->draw_list,(int)s->x,(int)s->y,s->w,s->h,*(undefined8 *)&s[1].header);
      }
    }
    uVar1 = 0;
    if (cmds->allocated + ((cmds->memory).size - cmds->size) < cmds->needed) {
      uVar1 = 2;
    }
    uVar2 = 0;
    if (vertices->allocated < vertices->needed) {
      uVar2 = 4;
    }
    uVar3 = 0;
    if (elements->allocated < elements->needed) {
      uVar3 = 8;
    }
    ctx_local._4_4_ = uVar3 | uVar2 | uVar1;
  }
  return ctx_local._4_4_;
}

Assistant:

NK_API nk_flags
nk_convert(struct nk_context *ctx, struct nk_buffer *cmds,
    struct nk_buffer *vertices, struct nk_buffer *elements,
    const struct nk_convert_config *config)
{
    nk_flags res = NK_CONVERT_SUCCESS;
    const struct nk_command *cmd;
    NK_ASSERT(ctx);
    NK_ASSERT(cmds);
    NK_ASSERT(vertices);
    NK_ASSERT(elements);
    NK_ASSERT(config);
    NK_ASSERT(config->vertex_layout);
    NK_ASSERT(config->vertex_size);
    if (!ctx || !cmds || !vertices || !elements || !config || !config->vertex_layout)
        return NK_CONVERT_INVALID_PARAM;

    nk_draw_list_setup(&ctx->draw_list, config, cmds, vertices, elements,
        config->line_AA, config->shape_AA);
    nk_foreach(cmd, ctx)
    {
#ifdef NK_INCLUDE_COMMAND_USERDATA
        ctx->draw_list.userdata = cmd->userdata;
#endif
        switch (cmd->type) {
        case NK_COMMAND_NOP: break;
        case NK_COMMAND_SCISSOR: {
            const struct nk_command_scissor *s = (const struct nk_command_scissor*)cmd;
            nk_draw_list_add_clip(&ctx->draw_list, nk_rect(s->x, s->y, s->w, s->h));
        } break;
        case NK_COMMAND_LINE: {
            const struct nk_command_line *l = (const struct nk_command_line*)cmd;
            nk_draw_list_stroke_line(&ctx->draw_list, nk_vec2(l->begin.x, l->begin.y),
                nk_vec2(l->end.x, l->end.y), l->color, l->line_thickness);
        } break;
        case NK_COMMAND_CURVE: {
            const struct nk_command_curve *q = (const struct nk_command_curve*)cmd;
            nk_draw_list_stroke_curve(&ctx->draw_list, nk_vec2(q->begin.x, q->begin.y),
                nk_vec2(q->ctrl[0].x, q->ctrl[0].y), nk_vec2(q->ctrl[1].x,
                q->ctrl[1].y), nk_vec2(q->end.x, q->end.y), q->color,
                config->curve_segment_count, q->line_thickness);
        } break;
        case NK_COMMAND_RECT: {
            const struct nk_command_rect *r = (const struct nk_command_rect*)cmd;
            nk_draw_list_stroke_rect(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
                r->color, (float)r->rounding, r->line_thickness);
        } break;
        case NK_COMMAND_RECT_FILLED: {
            const struct nk_command_rect_filled *r = (const struct nk_command_rect_filled*)cmd;
            nk_draw_list_fill_rect(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
                r->color, (float)r->rounding);
        } break;
        case NK_COMMAND_RECT_MULTI_COLOR: {
            const struct nk_command_rect_multi_color *r = (const struct nk_command_rect_multi_color*)cmd;
            nk_draw_list_fill_rect_multi_color(&ctx->draw_list, nk_rect(r->x, r->y, r->w, r->h),
                r->left, r->top, r->right, r->bottom);
        } break;
        case NK_COMMAND_CIRCLE: {
            const struct nk_command_circle *c = (const struct nk_command_circle*)cmd;
            nk_draw_list_stroke_circle(&ctx->draw_list, nk_vec2((float)c->x + (float)c->w/2,
                (float)c->y + (float)c->h/2), (float)c->w/2, c->color,
                config->circle_segment_count, c->line_thickness);
        } break;
        case NK_COMMAND_CIRCLE_FILLED: {
            const struct nk_command_circle_filled *c = (const struct nk_command_circle_filled *)cmd;
            nk_draw_list_fill_circle(&ctx->draw_list, nk_vec2((float)c->x + (float)c->w/2,
                (float)c->y + (float)c->h/2), (float)c->w/2, c->color,
                config->circle_segment_count);
        } break;
        case NK_COMMAND_ARC: {
            const struct nk_command_arc *c = (const struct nk_command_arc*)cmd;
            nk_draw_list_path_line_to(&ctx->draw_list, nk_vec2(c->cx, c->cy));
            nk_draw_list_path_arc_to(&ctx->draw_list, nk_vec2(c->cx, c->cy), c->r,
                c->a[0], c->a[1], config->arc_segment_count);
            nk_draw_list_path_stroke(&ctx->draw_list, c->color, NK_STROKE_CLOSED, c->line_thickness);
        } break;
        case NK_COMMAND_ARC_FILLED: {
            const struct nk_command_arc_filled *c = (const struct nk_command_arc_filled*)cmd;
            nk_draw_list_path_line_to(&ctx->draw_list, nk_vec2(c->cx, c->cy));
            nk_draw_list_path_arc_to(&ctx->draw_list, nk_vec2(c->cx, c->cy), c->r,
                c->a[0], c->a[1], config->arc_segment_count);
            nk_draw_list_path_fill(&ctx->draw_list, c->color);
        } break;
        case NK_COMMAND_TRIANGLE: {
            const struct nk_command_triangle *t = (const struct nk_command_triangle*)cmd;
            nk_draw_list_stroke_triangle(&ctx->draw_list, nk_vec2(t->a.x, t->a.y),
                nk_vec2(t->b.x, t->b.y), nk_vec2(t->c.x, t->c.y), t->color,
                t->line_thickness);
        } break;
        case NK_COMMAND_TRIANGLE_FILLED: {
            const struct nk_command_triangle_filled *t = (const struct nk_command_triangle_filled*)cmd;
            nk_draw_list_fill_triangle(&ctx->draw_list, nk_vec2(t->a.x, t->a.y),
                nk_vec2(t->b.x, t->b.y), nk_vec2(t->c.x, t->c.y), t->color);
        } break;
        case NK_COMMAND_POLYGON: {
            int i;
            const struct nk_command_polygon*p = (const struct nk_command_polygon*)cmd;
            for (i = 0; i < p->point_count; ++i) {
                struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
                nk_draw_list_path_line_to(&ctx->draw_list, pnt);
            }
            nk_draw_list_path_stroke(&ctx->draw_list, p->color, NK_STROKE_CLOSED, p->line_thickness);
        } break;
        case NK_COMMAND_POLYGON_FILLED: {
            int i;
            const struct nk_command_polygon_filled *p = (const struct nk_command_polygon_filled*)cmd;
            for (i = 0; i < p->point_count; ++i) {
                struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
                nk_draw_list_path_line_to(&ctx->draw_list, pnt);
            }
            nk_draw_list_path_fill(&ctx->draw_list, p->color);
        } break;
        case NK_COMMAND_POLYLINE: {
            int i;
            const struct nk_command_polyline *p = (const struct nk_command_polyline*)cmd;
            for (i = 0; i < p->point_count; ++i) {
                struct nk_vec2 pnt = nk_vec2((float)p->points[i].x, (float)p->points[i].y);
                nk_draw_list_path_line_to(&ctx->draw_list, pnt);
            }
            nk_draw_list_path_stroke(&ctx->draw_list, p->color, NK_STROKE_OPEN, p->line_thickness);
        } break;
        case NK_COMMAND_TEXT: {
            const struct nk_command_text *t = (const struct nk_command_text*)cmd;
            nk_draw_list_add_text(&ctx->draw_list, t->font, nk_rect(t->x, t->y, t->w, t->h),
                t->string, t->length, t->height, t->foreground);
        } break;
        case NK_COMMAND_IMAGE: {
            const struct nk_command_image *i = (const struct nk_command_image*)cmd;
            nk_draw_list_add_image(&ctx->draw_list, i->img, nk_rect(i->x, i->y, i->w, i->h), i->col);
        } break;
        case NK_COMMAND_CUSTOM: {
            const struct nk_command_custom *c = (const struct nk_command_custom*)cmd;
            c->callback(&ctx->draw_list, c->x, c->y, c->w, c->h, c->callback_data);
        } break;
        default: break;
        }
    }
    res |= (cmds->needed > cmds->allocated + (cmds->memory.size - cmds->size)) ? NK_CONVERT_COMMAND_BUFFER_FULL: 0;
    res |= (vertices->needed > vertices->allocated) ? NK_CONVERT_VERTEX_BUFFER_FULL: 0;
    res |= (elements->needed > elements->allocated) ? NK_CONVERT_ELEMENT_BUFFER_FULL: 0;
    return res;
}